

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_run_completed(uv_udp_t *handle)

{
  int iVar1;
  uv__queue *q_00;
  size_t sVar2;
  uv__queue *q;
  uv_udp_send_t *req;
  uv_udp_t *handle_local;
  
  if ((handle->flags & 0x1000000) != 0) {
    __assert_fail("!(handle->flags & UV_HANDLE_UDP_PROCESSING)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/udp.c"
                  ,0x5f,"void uv__udp_run_completed(uv_udp_t *)");
  }
  handle->flags = handle->flags | 0x1000000;
  while( true ) {
    iVar1 = uv__queue_empty(&handle->write_completed_queue);
    if (iVar1 != 0) {
      iVar1 = uv__queue_empty(&handle->write_queue);
      if (iVar1 != 0) {
        uv__io_stop(handle->loop,&handle->io_watcher,4);
        iVar1 = uv__io_active(&handle->io_watcher,1);
        if (((iVar1 == 0) && ((handle->flags & 4) != 0)) &&
           (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
          handle->loop->active_handles = handle->loop->active_handles - 1;
        }
      }
      handle->flags = handle->flags & 0xfeffffff;
      return;
    }
    q_00 = uv__queue_head(&handle->write_completed_queue);
    uv__queue_remove(q_00);
    if ((handle->loop->active_reqs).count == 0) break;
    (handle->loop->active_reqs).count = (handle->loop->active_reqs).count - 1;
    sVar2 = uv__count_bufs((uv_buf_t *)q_00[9].prev,*(uint *)&q_00[9].next);
    handle->send_queue_size = handle->send_queue_size - sVar2;
    handle->send_queue_count = handle->send_queue_count - 1;
    if (q_00[9].prev != q_00 + 0xb) {
      uv__free(q_00[9].prev);
    }
    q_00[9].prev = (uv__queue *)0x0;
    if (q_00[10].prev != (uv__queue *)0x0) {
      if ((long)q_00[10].next < 0) {
        (*(code *)q_00[10].prev)(q_00 + -5,(ulong)q_00[10].next & 0xffffffff);
      }
      else {
        (*(code *)q_00[10].prev)(q_00 + -5,0);
      }
    }
  }
  __assert_fail("uv__has_active_reqs(handle->loop)",
                "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/udp.c"
                ,0x67,"void uv__udp_run_completed(uv_udp_t *)");
}

Assistant:

static void uv__udp_run_completed(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct uv__queue* q;

  assert(!(handle->flags & UV_HANDLE_UDP_PROCESSING));
  handle->flags |= UV_HANDLE_UDP_PROCESSING;

  while (!uv__queue_empty(&handle->write_completed_queue)) {
    q = uv__queue_head(&handle->write_completed_queue);
    uv__queue_remove(q);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    uv__req_unregister(handle->loop, req);

    handle->send_queue_size -= uv__count_bufs(req->bufs, req->nbufs);
    handle->send_queue_count--;

    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;

    if (req->send_cb == NULL)
      continue;

    /* req->status >= 0 == bytes written
     * req->status <  0 == errno
     */
    if (req->status >= 0)
      req->send_cb(req, 0);
    else
      req->send_cb(req, req->status);
  }

  if (uv__queue_empty(&handle->write_queue)) {
    /* Pending queue and completion queue empty, stop watcher. */
    uv__io_stop(handle->loop, &handle->io_watcher, POLLOUT);
    if (!uv__io_active(&handle->io_watcher, POLLIN))
      uv__handle_stop(handle);
  }

  handle->flags &= ~UV_HANDLE_UDP_PROCESSING;
}